

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.h
# Opt level: O3

void __thiscall
agge::renderer::operator()
          (renderer *this,bitmap<unsigned_char,_0UL,_0UL> *bitmap_,vector_i offset,rect_i *window,
          rasterizer<agge::tests::(anonymous_namespace)::passthrough_clipper<float>,_agge::scaling<float>_>
          *mask,blender<unsigned_char,_unsigned_char> *blender,
          simple_alpha<unsigned_char,_8UL> *alpha)

{
  short *psVar1;
  short sVar2;
  count_t cVar3;
  int iVar4;
  pointer puVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint8_t *__s;
  uint8_t *puVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  int y;
  int x;
  uint8_t uVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  uint8_t *puVar19;
  uint length;
  int iVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  short *psVar24;
  short *psVar25;
  int iVar26;
  uint uVar27;
  
  iVar22 = offset.dx;
  iVar6 = bitmap_->_width + iVar22;
  uVar27 = 0;
  if (window[6].x1 <= window[6].y2) {
    uVar27 = (window[6].x2 - window[6].y1) + 1;
  }
  cVar3 = bitmap_->_height;
  uVar13 = uVar27 + 4;
  if ((this->_scanline_cache)._size < uVar13) {
    __s = (uint8_t *)operator_new__((ulong)uVar13);
    puVar11 = (this->_scanline_cache)._buffer;
    if (puVar11 != (uint8_t *)0x0) {
      operator_delete__(puVar11);
    }
    (this->_scanline_cache)._buffer = __s;
    (this->_scanline_cache)._size = uVar13;
    if (uVar27 < 0xfffffffc) {
      memset(__s,0,(ulong)uVar13);
    }
    else {
      *__s = '\0';
      if (uVar13 < 2) {
        puVar11 = __s + 1;
      }
      else {
        __s[1] = '\0';
        if (uVar13 == 2) goto LAB_00160522;
        puVar11 = __s + 2;
      }
      *puVar11 = '\0';
    }
  }
  else {
    __s = (this->_scanline_cache)._buffer;
  }
LAB_00160522:
  iVar4 = window[6].x1;
  lVar17 = (long)iVar4;
  iVar7 = (window[6].y2 - iVar4) + 1;
  if (window[6].y2 < iVar4) {
    iVar7 = 0;
  }
  if (0 < iVar7) {
    do {
      if (((long)offset >> 0x20 <= lVar17) && (lVar17 < (long)(int)cVar3 + ((long)offset >> 0x20)))
      {
        lVar14 = lVar17 * 4 + *(long *)&window[1].x2;
        uVar27 = *(uint *)(lVar14 + (long)window[6].x1 * -4);
        uVar13 = *(uint *)(lVar14 + (long)window[6].x1 * -4 + 4);
        y = (int)lVar17;
        puVar5 = (bitmap_->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar14 = (ulong)bitmap_->_width * (ulong)(uint)(y - offset.dy) - (long)iVar22;
        iVar20 = 0;
        iVar23 = 0;
        if (uVar27 != uVar13) {
          psVar1 = (short *)(*(long *)window + (ulong)uVar13 * 10);
          psVar25 = (short *)(*(long *)window + (ulong)uVar27 * 10);
          iVar20 = 0;
          iVar23 = 0;
          iVar26 = 0;
          puVar11 = __s;
LAB_001605f6:
          sVar2 = *psVar25;
          iVar18 = (int)sVar2;
          iVar8 = 0;
          do {
            psVar24 = psVar25 + 5;
            iVar8 = iVar8 + *(int *)(psVar25 + 2);
            iVar26 = psVar25[4] + iVar26;
            psVar25 = psVar1;
            if (psVar24 == psVar1) break;
            psVar25 = psVar24;
          } while (*psVar24 == sVar2);
          iVar16 = iVar26 * 0x200;
          puVar19 = puVar11;
          if (iVar8 != 0) {
            iVar8 = iVar16 - iVar8 >> 9;
            if (0xfe < iVar8) {
              iVar8 = 0xff;
            }
            iVar10 = iVar23;
            if (iVar20 != iVar18) {
              x = iVar23;
              if (iVar22 - iVar23 != 0 && iVar23 <= iVar22) {
                x = iVar22;
              }
              iVar9 = -(iVar22 - iVar23);
              iVar10 = 0;
              if (iVar23 < iVar22) {
                iVar10 = iVar9;
              }
              uVar13 = iVar10 + (iVar20 - iVar23);
              uVar27 = iVar6 - x;
              if ((int)uVar13 < iVar6 - x) {
                uVar27 = uVar13;
              }
              puVar11 = __s;
              iVar20 = iVar18;
              iVar10 = iVar18;
              if (0 < (int)uVar27) {
                lVar21 = -(long)iVar9;
                if (iVar22 <= iVar23) {
                  lVar21 = 0;
                }
                tests::mocks::blender<unsigned_char,_unsigned_char>::operator()
                          ((blender<unsigned_char,_unsigned_char> *)mask,puVar5 + x + lVar14,x,y,
                           uVar27,__s + lVar21);
              }
            }
            iVar20 = iVar20 + 1;
            *puVar11 = (uint8_t)iVar8;
            puVar19 = puVar11 + 1;
            iVar18 = iVar18 + 1;
            iVar23 = iVar10;
          }
          if (psVar24 != psVar1) {
            uVar27 = *psVar25 - iVar18;
            puVar11 = puVar19;
            if ((uVar27 != 0) && (iVar16 != 0)) {
              uVar13 = iVar16 >> 9;
              if (0xfe < iVar16 >> 9) {
                uVar13 = 0xff;
              }
              iVar8 = iVar23;
              if (iVar20 != iVar18) {
                iVar16 = iVar23;
                if (iVar22 - iVar23 != 0 && iVar23 <= iVar22) {
                  iVar16 = iVar22;
                }
                iVar10 = -(iVar22 - iVar23);
                iVar8 = 0;
                if (iVar23 < iVar22) {
                  iVar8 = iVar10;
                }
                uVar12 = iVar8 + (iVar20 - iVar23);
                length = iVar6 - iVar16;
                if ((int)uVar12 < iVar6 - iVar16) {
                  length = uVar12;
                }
                puVar19 = __s;
                iVar20 = iVar18;
                iVar8 = iVar18;
                if (0 < (int)length) {
                  lVar21 = -(long)iVar10;
                  if (iVar22 <= iVar23) {
                    lVar21 = 0;
                  }
                  tests::mocks::blender<unsigned_char,_unsigned_char>::operator()
                            ((blender<unsigned_char,_unsigned_char> *)mask,puVar5 + iVar16 + lVar14,
                             iVar16,y,length,__s + lVar21);
                }
              }
              iVar23 = iVar8;
              iVar20 = iVar20 + uVar27;
              puVar11 = puVar19 + uVar27;
              uVar15 = (uint8_t)uVar13;
              if (3 < uVar27) {
                memset(puVar19,uVar13 & 0xff,(ulong)uVar27);
                goto LAB_001605f6;
              }
              *puVar19 = uVar15;
              if (uVar27 < 2) {
                puVar19 = puVar19 + 1;
              }
              else {
                puVar19[1] = uVar15;
                if (uVar27 == 2) goto LAB_001605f6;
                puVar19 = puVar19 + 2;
              }
              *puVar19 = uVar15;
            }
            goto LAB_001605f6;
          }
        }
        iVar26 = iVar23;
        if (iVar22 - iVar23 != 0 && iVar23 <= iVar22) {
          iVar26 = iVar22;
        }
        iVar18 = -(iVar22 - iVar23);
        iVar8 = 0;
        if (iVar23 < iVar22) {
          iVar8 = iVar18;
        }
        uVar13 = iVar8 + (iVar20 - iVar23);
        uVar27 = iVar6 - iVar26;
        if ((int)uVar13 < iVar6 - iVar26) {
          uVar27 = uVar13;
        }
        if (0 < (int)uVar27) {
          lVar21 = -(long)iVar18;
          if (iVar22 <= iVar23) {
            lVar21 = 0;
          }
          tests::mocks::blender<unsigned_char,_unsigned_char>::operator()
                    ((blender<unsigned_char,_unsigned_char> *)mask,puVar5 + iVar26 + lVar14,iVar26,y
                     ,uVar27,__s + lVar21);
        }
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < iVar7 + iVar4);
  }
  return;
}

Assistant:

inline void renderer::operator ()(BitmapT &bitmap_, vector_i offset, const rect_i *window, const MaskT &mask, const BlenderT &blender,
		const AlphaFn &alpha)
	{
		typedef adapter<BitmapT, BlenderT> rendition_adapter;

		rendition_adapter ra(bitmap_, offset, window, blender);
		scanline_adapter<rendition_adapter> scanline(ra, _scanline_cache, mask.width());

		render(scanline, mask, alpha, 0, 1);
	}